

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

boolean artifact_hit(monst *magr,monst *mdef,obj *otmp,obj *ostack,boolean thrown,int *dmgptr,
                    int dieroll)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  bool youattack_00;
  bool bVar6;
  bool local_2a3;
  bool local_2a2;
  bool local_2a1;
  char *local_2a0;
  bool local_28a;
  char *local_288;
  bool local_265;
  byte local_264;
  byte local_263;
  byte local_262;
  char local_261;
  obj *poStack_260;
  boolean beheaded;
  obj *olaunch;
  char wepbuf [256];
  char hittee [256];
  obj **local_50;
  char *wepdesc;
  boolean msg_printed;
  boolean realizes_damage;
  boolean vis;
  boolean youdefend;
  boolean youattack;
  int *dmgptr_local;
  boolean thrown_local;
  obj *ostack_local;
  obj *otmp_local;
  monst *mdef_local;
  monst *magr_local;
  
  youattack_00 = magr == &youmonst;
  bVar6 = mdef == &youmonst;
  if ((((youattack_00) || (magr == (monst *)0x0)) ||
      (local_262 = 1, (viz_array[magr->my][magr->mx] & 2U) == 0)) &&
     ((bVar6 || (local_262 = 1, (viz_array[mdef->my][mdef->mx] & 2U) == 0)))) {
    local_263 = 0;
    if ((youattack_00) &&
       ((local_263 = 0, (u._1052_1_ & 1) != 0 && (local_263 = 0, mdef == u.ustuck)))) {
      if ((u.uprops[0x1e].intrinsic != 0) ||
         (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
          (local_264 = 0, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
        local_265 = false;
        if (ublindf != (obj *)0x0) {
          local_265 = ublindf->oartifact == '\x1d';
        }
        local_264 = local_265 ^ 0xff;
      }
      local_263 = local_264 ^ 0xff;
    }
    local_262 = local_263;
  }
  wepdesc._3_1_ = false;
  poStack_260 = (obj *)0x0;
  if (thrown != '\0') {
    if (youattack_00) {
      poStack_260 = uwep;
    }
    else if (magr != (monst *)0x0) {
      poStack_260 = magr->mw;
    }
    if ((poStack_260 != (obj *)0x0) &&
       (((((poStack_260->oclass != '\x02' || (objects[poStack_260->otyp].oc_subtyp < '\x16')) ||
          (('\x18' < objects[poStack_260->otyp].oc_subtyp ||
           ((otmp->oclass != '\x02' && (otmp->oclass != '\r')))))) ||
         (objects[otmp->otyp].oc_subtyp < -0x18)) ||
        (((-0x16 < objects[otmp->otyp].oc_subtyp || (poStack_260 == (obj *)0x0)) ||
         ((int)objects[otmp->otyp].oc_subtyp != -(int)objects[poStack_260->otyp].oc_subtyp)))))) {
      poStack_260 = (obj *)0x0;
    }
  }
  if ((otmp->oartifact == '\0') &&
     (bVar1 = oprop_attack(0xf,otmp,poStack_260,thrown), bVar1 == '\0')) {
    magr_local._7_1_ = false;
  }
  else {
    pcVar3 = "The";
    if (youattack_00) {
      pcVar3 = "Your";
    }
    pcVar4 = distant_name(otmp,xname);
    snprintf((char *)&olaunch,0x100,"%s %s",pcVar3,pcVar4);
    local_50 = &olaunch;
    if (bVar6) {
      local_288 = "you";
    }
    else {
      local_288 = mon_nam(mdef);
    }
    strcpy(wepbuf + 0xf8,local_288);
    iVar2 = spec_dbon(otmp,poStack_260,thrown,mdef,*dmgptr);
    *dmgptr = iVar2 + *dmgptr;
    if ((youattack_00) && (bVar6)) {
      warning("attacking yourself with weapon?");
      magr_local._7_1_ = false;
    }
    else {
      local_28a = true;
      if ((!bVar6) && (local_28a = true, (local_262 & 1) == 0)) {
        local_28a = youattack_00 && mdef == u.ustuck;
      }
      bVar1 = attacks(2,otmp,poStack_260,thrown);
      if (bVar1 != '\0') {
        if ((local_28a) && ((otmp->oartifact != '\0' || (spec_applies_ad_fire != '\0')))) {
          if (otmp->oartifact == '\f') {
            local_50 = (obj **)0x35b329;
          }
          if (spec_applies_ad_fire == '\0') {
            local_2a0 = "hits";
          }
          else {
            local_2a0 = "burns";
            if (mdef->data == mons + 0xa2) {
              local_2a0 = "vaporizes part of";
            }
          }
          uVar5 = 0x21;
          if (spec_applies_ad_fire == '\0') {
            uVar5 = 0x2e;
          }
          pline("%s %s %s%c",local_50,local_2a0,wepbuf + 0xf8,uVar5);
          wepdesc._3_1_ = true;
          if (spec_applies_ad_fire != '\0') {
            oprop_id(1,otmp,ostack,poStack_260);
          }
        }
        iVar2 = rn2(4);
        if (((iVar2 == 0) && (bVar1 = destroy_mitem(mdef,8,2,dmgptr), bVar1 != '\0')) && (local_28a)
           ) {
          oprop_id(1,otmp,ostack,poStack_260);
        }
        iVar2 = rn2(4);
        if (((iVar2 == 0) && (bVar1 = destroy_mitem(mdef,9,2,dmgptr), bVar1 != '\0')) && (local_28a)
           ) {
          oprop_id(1,otmp,ostack,poStack_260);
        }
        iVar2 = rn2(7);
        if (((iVar2 == 0) && (bVar1 = destroy_mitem(mdef,10,2,dmgptr), bVar1 != '\0')) &&
           (local_28a)) {
          oprop_id(1,otmp,ostack,poStack_260);
        }
        if ((bVar6) && (u.uprops[0x3a].intrinsic != 0)) {
          burn_away_slime();
          oprop_id(1,otmp,ostack,poStack_260);
        }
      }
      bVar1 = attacks(3,otmp,poStack_260,thrown);
      if (bVar1 != '\0') {
        if ((local_28a) && ((otmp->oartifact != '\0' || (spec_applies_ad_cold != '\0')))) {
          if (otmp->oartifact == '\v') {
            local_50 = (obj **)0x35b356;
          }
          pcVar3 = "freezes";
          if (spec_applies_ad_cold == '\0') {
            pcVar3 = "hits";
          }
          uVar5 = 0x21;
          if (spec_applies_ad_cold == '\0') {
            uVar5 = 0x2e;
          }
          pline("%s %s %s%c",local_50,pcVar3,wepbuf + 0xf8,uVar5);
          wepdesc._3_1_ = true;
          if (spec_applies_ad_cold != '\0') {
            oprop_id(2,otmp,ostack,poStack_260);
          }
        }
        iVar2 = rn2(4);
        if (((iVar2 == 0) && (bVar1 = destroy_mitem(mdef,8,3,dmgptr), bVar1 != '\0')) && (local_28a)
           ) {
          oprop_id(2,otmp,ostack,poStack_260);
        }
      }
      bVar1 = attacks(6,otmp,poStack_260,thrown);
      if (bVar1 != '\0') {
        if ((local_28a) && ((otmp->oartifact != '\0' || (spec_applies_ad_elec != '\0')))) {
          pcVar3 = "!  Lightning strikes";
          if (spec_applies_ad_elec == '\0') {
            pcVar3 = "";
          }
          uVar5 = 0x21;
          if (spec_applies_ad_elec == '\0') {
            uVar5 = 0x2e;
          }
          pline("The massive hammer hits%s %s%c",pcVar3,wepbuf + 0xf8,uVar5);
          wepdesc._3_1_ = true;
        }
        iVar2 = rn2(5);
        if (iVar2 == 0) {
          destroy_mitem(mdef,0xb,6,dmgptr);
        }
      }
      bVar1 = attacks(1,otmp,poStack_260,thrown);
      if (((bVar1 != '\0') && (local_28a)) &&
         ((otmp->oartifact != '\0' || (spec_applies_ad_magm != '\0')))) {
        pcVar3 = "!  A hail of magic missiles strikes";
        if (spec_applies_ad_magm == '\0') {
          pcVar3 = "";
        }
        uVar5 = 0x21;
        if (spec_applies_ad_magm == '\0') {
          uVar5 = 0x2e;
        }
        pline("The imaginary widget hits%s %s%c",pcVar3,wepbuf + 0xf8,uVar5);
        wepdesc._3_1_ = true;
      }
      bVar1 = attacks(0xc,otmp,poStack_260,thrown);
      if ((bVar1 != '\0') && (dieroll < 9)) {
        bVar1 = magicbane_hit(magr,mdef,otmp,dmgptr,dieroll,local_262 & 1,wepbuf + 0xf8);
        local_2a1 = bVar1 != '\0' || wepdesc._3_1_ != false;
        wepdesc._3_1_ = local_2a1;
      }
      if ((((otmp->oartifact == '\x04') && (bVar6)) || (spec_dbon_applies != 0)) ||
         ((spec_applies_ad_drli != '\0' || (spec_applies_spfx_behead != '\0')))) {
        if ((spec_applies_ad_drli != '\0') &&
           ((bVar1 = spec_ability(otmp,0x100), bVar1 != '\0' ||
            (bVar1 = oprop_attack(4,otmp,poStack_260,thrown), bVar1 != '\0')))) {
          bVar1 = artifact_hit_drainlife(magr,mdef,otmp,ostack,poStack_260,dmgptr);
          local_2a2 = bVar1 != '\0' || wepdesc._3_1_ != false;
          wepdesc._3_1_ = local_2a2;
        }
        if ((spec_applies_spfx_behead != '\0') &&
           ((bVar1 = spec_ability(otmp,0x400), bVar1 != '\0' ||
            (bVar1 = oprop_attack(8,otmp,poStack_260,thrown), bVar1 != '\0')))) {
          bVar1 = artifact_hit_behead(magr,mdef,otmp,ostack,poStack_260,dmgptr,dieroll,wepdesc._3_1_
                                      ,&local_261);
          local_2a3 = bVar1 != '\0' || wepdesc._3_1_ != false;
          wepdesc._3_1_ = local_2a3;
          if (local_261 != '\0') {
            return local_2a3;
          }
        }
        if (((((otmp->oartifact == '\b') || (otmp->oartifact == '\r')) ||
             (otmp->oartifact == '\x0e')) ||
            (((otmp->oartifact == '\x0f' || (otmp->oartifact == '\x13')) ||
             ((otmp->oartifact == '\x04' || (otmp->oartifact == '\x12')))))) &&
           (((*(uint *)&mdef->field_0x60 >> 8 & 1) == 0 && (dieroll < 4)))) {
          if (local_28a) {
            pcVar3 = distant_name(otmp,xname);
            pcVar3 = The(pcVar3);
            if ((u.uprops[0x1e].intrinsic != 0) ||
               (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
                (bVar6 = false, ((youmonst.data)->mflags1 & 0x1000) != 0)))) {
              bVar6 = false;
              if (ublindf != (obj *)0x0) {
                bVar6 = ublindf->oartifact == '\x1d';
              }
              bVar6 = (bool)(bVar6 ^ 1);
            }
            pcVar4 = "shines brilliantly";
            if (bVar6) {
              pcVar4 = "roars deafeningly";
            }
            pline("%s %s as it strikes %s!",pcVar3,pcVar4,wepbuf + 0xf8);
          }
          cancel_monst(mdef,otmp,youattack_00,'\x01',magr == mdef);
          wepdesc._3_1_ = true;
        }
        magr_local._7_1_ = wepdesc._3_1_;
      }
      else {
        magr_local._7_1_ = wepdesc._3_1_;
      }
    }
  }
  return magr_local._7_1_;
}

Assistant:

boolean artifact_hit(
    struct monst *magr,
    struct monst *mdef,
    struct obj *otmp,
    struct obj *ostack,
    boolean thrown,
    int *dmgptr,
    int dieroll /* needed for Magicbane and vorpal blades */
    )
{
	boolean youattack = (magr == &youmonst);
	boolean youdefend = (mdef == &youmonst);
	boolean vis = (!youattack && magr && cansee(magr->mx, magr->my))
	    || (!youdefend && cansee(mdef->mx, mdef->my))
	    || (youattack && u.uswallow && mdef == u.ustuck && !Blind);
	boolean realizes_damage;
	boolean msg_printed = FALSE;
	const char *wepdesc;
	char hittee[BUFSZ];
	char wepbuf[BUFSZ];
	struct obj *olaunch = NULL;

	if (thrown) {
	    /* Launcher properties stack with fired ammunition,
	     * so get the launcher here if that's the case. */
	    if (youattack)
		olaunch = uwep;
	    else if (magr)
		olaunch = MON_WEP(magr);

	    if (olaunch && (!is_launcher(olaunch) ||
			    !ammo_and_launcher(otmp, olaunch)))
		olaunch = NULL;
	}

	/* Exit early if not an artifact or absent of attack properties. */
	if (!otmp->oartifact &&
	    !oprop_attack(ITEM_FIRE|ITEM_FROST|ITEM_DRLI|ITEM_VORPAL,
			  otmp, olaunch, thrown))
	    return FALSE;

	snprintf(wepbuf, BUFSZ, "%s %s", youattack ? "Your" : "The",
					 distant_name(otmp, xname));
	wepdesc = wepbuf;

	strcpy(hittee, youdefend ? "you" : mon_nam(mdef));

	/* The following takes care of most of the damage, but not all--
	 * the exception being for level draining, which is specially
	 * handled.  Messages are done in this function, however.
	 */
	*dmgptr += spec_dbon(otmp, olaunch, thrown, mdef, *dmgptr);

	if (youattack && youdefend) {
	    warning("attacking yourself with weapon?");
	    return FALSE;
	}

	realizes_damage = (youdefend || vis || 
			   /* feel the effect even if not seen */
			   (youattack && mdef == u.ustuck));

	/* the four basic attacks: fire, cold, shock and missiles */
	if (attacks(AD_FIRE, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_fire)) {
		if (otmp->oartifact == ART_FIRE_BRAND)
		    wepdesc = "The fiery blade";
		pline("%s %s %s%c",
			wepdesc,
			!spec_applies_ad_fire ? "hits" :
			(mdef->data == &mons[PM_WATER_ELEMENTAL]) ?
			"vaporizes part of" : "burns",
			hittee, !spec_applies_ad_fire ? '.' : '!');
		msg_printed = TRUE;
		if (spec_applies_ad_fire)
		    oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, POTION_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, SCROLL_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (!rn2(7)) {
		if (destroy_mitem(mdef, SPBOOK_CLASS, AD_FIRE, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
		}
	    }
	    if (youdefend && Slimed) {
		burn_away_slime();
		oprop_id(ITEM_FIRE, otmp, ostack, olaunch);
	    }
	}

	if (attacks(AD_COLD, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_cold)) {
		if (otmp->oartifact == ART_FROST_BRAND)
		    wepdesc = "The ice-cold blade";
		pline("%s %s %s%c",
			wepdesc,
			!spec_applies_ad_cold ? "hits" : "freezes",
			hittee, !spec_applies_ad_cold ? '.' : '!');
		msg_printed = TRUE;
		if (spec_applies_ad_cold)
		    oprop_id(ITEM_FROST, otmp, ostack, olaunch);
	    }
	    if (!rn2(4)) {
		if (destroy_mitem(mdef, POTION_CLASS, AD_COLD, dmgptr)) {
		    if (realizes_damage)
			oprop_id(ITEM_FROST, otmp, ostack, olaunch);
		}
	    }
	}

	if (attacks(AD_ELEC, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_elec)) {
		pline("The massive hammer hits%s %s%c",
			  !spec_applies_ad_elec ? "" : "!  Lightning strikes",
			  hittee, !spec_applies_ad_elec ? '.' : '!');
		msg_printed = TRUE;
	    }
	    if (!rn2(5)) destroy_mitem(mdef, WAND_CLASS, AD_ELEC, dmgptr);
	}

	if (attacks(AD_MAGM, otmp, olaunch, thrown)) {
	    if (realizes_damage && (otmp->oartifact || spec_applies_ad_magm)) {
		pline("The imaginary widget hits%s %s%c",
			  !spec_applies_ad_magm ? "" :
				"!  A hail of magic missiles strikes",
			  hittee, !spec_applies_ad_magm ? '.' : '!');
		msg_printed = TRUE;
	    }
	}

	if (attacks(AD_STUN, otmp, olaunch, thrown) && dieroll <= MB_MAX_DIEROLL) {
	    /* Magicbane's special attacks (possibly modifies hittee[]) */
	    msg_printed = magicbane_hit(magr, mdef, otmp, dmgptr, dieroll, vis,
					hittee) || msg_printed;
	}

	if (otmp->oartifact != ART_THIEFBANE || !youdefend) {
	    if (!spec_dbon_applies &&
		!spec_applies_ad_drli && !spec_applies_spfx_behead) {
		/* since damage bonus didn't apply, nothing more to do;
		   no further attacks have side-effects on inventory */
		return msg_printed;
	    }
	}

	/* Stormbringer or thirsty weapon */
	if (spec_applies_ad_drli &&
	    (spec_ability(otmp, SPFX_DRLI) ||
	     oprop_attack(ITEM_DRLI, otmp, olaunch, thrown))) {
	    msg_printed = artifact_hit_drainlife(magr, mdef, otmp, ostack, olaunch,
						 dmgptr) || msg_printed;
	}

	/* Thiefbane, Tsurugi of Muramasa, Vorpal Blade or vorpal weapon */
	if (spec_applies_spfx_behead &&
	    (spec_ability(otmp, SPFX_BEHEAD) ||
	     oprop_attack(ITEM_VORPAL, otmp, olaunch, thrown))) {
	    boolean beheaded;
	    msg_printed = artifact_hit_behead(magr, mdef, otmp, ostack, olaunch,
					      dmgptr, dieroll, msg_printed,
					      &beheaded) || msg_printed;
	    /* No further effects if the monster was instakilled. */
	    if (beheaded)
		return msg_printed;
	}

	/* WAC -- 1/6 chance of cancellation with foobane weapons */
	if (otmp->oartifact == ART_ORCRIST ||
	    otmp->oartifact == ART_DRAGONBANE ||
	    otmp->oartifact == ART_DEMONBANE ||
	    otmp->oartifact == ART_WEREBANE ||
	    otmp->oartifact == ART_TROLLSBANE ||
	    otmp->oartifact == ART_THIEFBANE ||
	    otmp->oartifact == ART_OGRESMASHER) {
		if (!mdef->mcan && dieroll < 4) {
		    if (realizes_damage) {
			pline("%s %s as it strikes %s!",
			      The(distant_name(otmp, xname)),
			      Blind ? "roars deafeningly" : "shines brilliantly",
			      hittee);
		    }
		    cancel_monst(mdef, otmp, youattack, TRUE, magr == mdef);
		    msg_printed = TRUE;
		}
	}

	return msg_printed;
}